

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O1

int net_udp4_socket(sockaddr_in *saddr,unsigned_short port,uchar ttl)

{
  int iVar1;
  int iVar2;
  uchar loop;
  int on;
  undefined1 local_1e;
  uchar local_1d;
  undefined4 local_1c;
  
  local_1d = ttl;
  if (saddr == (sockaddr_in *)0x0) {
    __assert_fail("saddr != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/network4.c",0x3b,
                  "int net_udp4_socket(struct sockaddr_in *, unsigned short, unsigned char)");
  }
  iVar1 = socket(2,2,0);
  if (iVar1 < 0) {
    perror("socket");
    return -1;
  }
  local_1c = 1;
  iVar2 = setsockopt(iVar1,1,2,&local_1c,4);
  if ((-1 < iVar2) && (iVar2 = setsockopt(iVar1,1,6,&net_udp4_socket::allow,4), iVar2 != -1)) {
    saddr->sin_family = 2;
    saddr->sin_port = port << 8 | port >> 8;
    if (((saddr->sin_addr).s_addr & 0xf0) != 0xe0) {
      return iVar1;
    }
    local_1e = 1;
    iVar2 = setsockopt(iVar1,0,0x21,&local_1d,1);
    if ((-1 < iVar2) && (iVar2 = setsockopt(iVar1,0,0x22,&local_1e,1), -1 < iVar2)) {
      return iVar1;
    }
  }
  perror("setsockopt");
  iVar1 = close(iVar1);
  if (iVar1 < 0) {
    perror("close");
  }
  return -1;
}

Assistant:

int net_udp4_socket(struct sockaddr_in *saddr,
		    unsigned short port,
		    unsigned char ttl) {
  assert(saddr != NULL);
  
  /*M
    Create UDP socket.
  **/
  int fd;
  if ((fd = socket(PF_INET, SOCK_DGRAM, 0)) < 0) {
    perror("socket");
    return -1;
  }

  /*M
    Set socket to reuse addresses.
  **/
  int on = 1;
  if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on)) < 0) {
    perror("setsockopt");
    goto error;
  }

  {
    static int allow = 1;
    if (setsockopt(fd, SOL_SOCKET, SO_BROADCAST, (char*)&allow, sizeof(allow)) == -1) {
      perror("setsockopt");
      goto error;
    }
  }
    
  saddr->sin_family = AF_INET;
  saddr->sin_port   = htons(port);

  /*M
    If the address is a multicast address, set the TTL and turn on
    multicast loop so the local host can receive the UDP packets.
  **/
  if (IN_MULTICAST(htonl(saddr->sin_addr.s_addr))) {
    unsigned char loop = 1;
    if ((setsockopt(fd,
                    IPPROTO_IP,
                    IP_MULTICAST_TTL,
                    &ttl, sizeof(ttl)) < 0) ||
        (setsockopt(fd,
                    IPPROTO_IP,
                    IP_MULTICAST_LOOP,
                    &loop, sizeof(loop)) < 0)) {
      perror("setsockopt");
      goto error;
    }
  }

  return fd;

 error:
  if (close(fd) < 0)
    perror("close");
  return -1;
}